

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::SetSideDefined
          (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this,int side)

{
  int in_ESI;
  long in_RDI;
  TPZGeoElSide *in_stack_ffffffffffffffb0;
  TPZGeoMesh *in_stack_ffffffffffffffc8;
  TPZGeoElSideIndex *in_stack_ffffffffffffffd0;
  TPZGeoElSideIndex local_28;
  int local_c;
  
  local_c = in_ESI;
  TPZGeoElSide::TPZGeoElSide
            (in_stack_ffffffffffffffb0,(TPZGeoEl *)&stack0xffffffffffffffc0,
             (int)((ulong)in_RDI >> 0x20));
  TPZGeoElSideIndex::TPZGeoElSideIndex
            (in_stack_ffffffffffffffd0,(TPZGeoElSide *)in_stack_ffffffffffffffc8);
  TPZGeoElSideIndex::operator=
            ((TPZGeoElSideIndex *)(in_RDI + 0x1e0 + (long)local_c * 0x18),&local_28);
  TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1717007);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1717011);
  return;
}

Assistant:

virtual  void SetSideDefined(int side)  override { fNeighbours[side] = TPZGeoElSide(this,side); }